

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_int_2_suite::test_clear(void)

{
  undefined4 local_70;
  value_type_conflict1 local_6c [2];
  undefined4 local_64;
  size_type local_60;
  undefined4 local_54;
  size_type local_50;
  undefined4 local_44;
  size_type local_40 [2];
  undefined1 local_30 [8];
  moment<int,_2> filter;
  
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::basic_moment
            ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::push
            ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30,1);
  local_40[0] = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::size
                          ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_44 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1c6,"void mean_int_2_suite::test_clear()",local_40,&local_44);
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::clear
            ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_50 = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::size
                       ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_54 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1c8,"void mean_int_2_suite::test_clear()",&local_50,&local_54);
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::push
            ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30,2);
  local_60 = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::size
                       ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_64 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1ca,"void mean_int_2_suite::test_clear()",&local_60,&local_64);
  local_6c[0] = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::mean
                          ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_70 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("filter.mean()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1cb,"void mean_int_2_suite::test_clear()",local_6c,&local_70);
  return;
}

Assistant:

void test_clear()
{
    window::moment<int, 2> filter;
    filter.push(1);
    TRIAL_TEST_EQ(filter.size(), 1);
    filter.clear();
    TRIAL_TEST_EQ(filter.size(), 0);
    filter.push(2);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 2);
}